

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall kj::Disposer::dispose<capnp::_::RpcSystemBase::Impl>(Disposer *this,Impl *object)

{
  _func_int *local_30;
  Impl *object_local;
  Disposer *this_local;
  
  if (object == (Impl *)0x0) {
    local_30 = (_func_int *)0x0;
  }
  else {
    local_30 = (object->super_BootstrapFactoryBase)._vptr_BootstrapFactoryBase[-2] +
               (long)&(object->super_BootstrapFactoryBase)._vptr_BootstrapFactoryBase;
  }
  (**this->_vptr_Disposer)(this,local_30);
  return;
}

Assistant:

void Disposer::dispose(T* object) const {
  if constexpr (_kj_internal_isPolymorphic((T*)nullptr)) {
    // Note that dynamic_cast<void*> does not require RTTI to be enabled, because the offset to
    // the top of the object is in the vtable -- as it obviously needs to be to correctly implement
    // operator delete.
    disposeImpl(dynamic_cast<void*>(object));
  } else {
    disposeImpl(static_cast<void*>(object));
  }
}